

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::SpellAct(Character *this)

{
  unsigned_short spell_id;
  ushort uVar1;
  SpellTarget SVar2;
  Quest_Context *this_00;
  _Base_ptr this_01;
  bool bVar3;
  ESF_Data *pEVar4;
  Character *victim;
  NPC *npc;
  Quest *this_02;
  _Rb_tree_node_base *p_Var5;
  double dVar6;
  
  pEVar4 = ESF::Get(this->world->esf,(uint)this->spell_id);
  if ((pEVar4->id == 0) || (pEVar4->type == Bard)) {
    CancelSpell(this);
    return;
  }
  SVar2 = this->spell_target;
  spell_id = this->spell_id;
  uVar1 = this->spell_target_id;
  CancelSpell(this);
  dVar6 = Timer::GetTime();
  this->spell_fired_time = dVar6;
  switch(SVar2) {
  case TargetSelf:
    if (pEVar4->target_restrict != Friendly) {
      return;
    }
    if (pEVar4->target != Self) {
      return;
    }
    Map::SpellSelf(this->map,this,spell_id);
    break;
  case TargetNPC:
    if (pEVar4->target_restrict == Friendly) {
      return;
    }
    if (pEVar4->target != Normal) {
      return;
    }
    npc = Map::GetNPCIndex(this->map,(uchar)uVar1);
    if (npc != (NPC *)0x0) {
      Map::SpellAttack(this->map,this,npc,spell_id);
    }
    break;
  case TargetPlayer:
    if (pEVar4->target_restrict == NPCOnly) {
      return;
    }
    if (pEVar4->target != Normal) {
      return;
    }
    victim = Map::GetCharacterPID(this->map,(uint)uVar1);
    if ((victim == this) && (pEVar4->target_restrict != Friendly)) {
      return;
    }
    if (victim != (Character *)0x0) {
      Map::SpellAttackPK(this->map,this,victim,spell_id);
    }
    break;
  case TargetGroup:
    if (pEVar4->target_restrict != Friendly) {
      return;
    }
    if (pEVar4->target != Group) {
      return;
    }
    Map::SpellGroup(this->map,this,spell_id);
    break;
  default:
    goto switchD_00111f38_default;
  }
  for (p_Var5 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->quests)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    this_00 = (Quest_Context *)p_Var5[1]._M_parent;
    this_01 = p_Var5[1]._M_left;
    if (this_01 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
      }
    }
    if (this_00 != (Quest_Context *)0x0) {
      this_02 = Quest_Context::GetQuest(this_00);
      bVar3 = Quest::Disabled(this_02);
      if (!bVar3) {
        Quest_Context::UsedSpell(this_00,spell_id);
      }
    }
    if (this_01 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
  }
switchD_00111f38_default:
  return;
}

Assistant:

void Character::SpellAct()
{
	const ESF_Data &spell = world->esf->Get(this->spell_id);

	if (spell.id == 0 || spell.type == ESF::Bard)
	{
		this->CancelSpell();
		return;
	}

	Character *victim;
	NPC *npc_victim;

	SpellTarget spell_target = this->spell_target;
	short spell_id = this->spell_id;
	unsigned short spell_target_id = this->spell_target_id;
	this->CancelSpell();

	this->spell_fired_time = Timer::GetTime();

	switch (spell_target)
	{
		case TargetSelf:
			if (spell.target_restrict != ESF::Friendly || spell.target != ESF::Self)
				return;

			this->map->SpellSelf(this, spell_id);

			break;

		case TargetNPC:
			if (spell.target_restrict == ESF::Friendly || spell.target != ESF::Normal)
				return;

			npc_victim = this->map->GetNPCIndex(spell_target_id);

			if (npc_victim)
				this->map->SpellAttack(this, npc_victim, spell_id);

			// *npc_victim may not be valid here

			break;

		case TargetPlayer:
			if (spell.target_restrict == ESF::NPCOnly || spell.target != ESF::Normal)
				return;

			victim = this->map->GetCharacterPID(spell_target_id);

			if (spell.target_restrict != ESF::Friendly && victim == this)
				return;

			if (victim)
				this->map->SpellAttackPK(this, victim, spell_id);

			break;

		case TargetGroup:
			if (spell.target_restrict != ESF::Friendly || spell.target != ESF::Group)
				return;

			this->map->SpellGroup(this, spell_id);

			break;

		default:
			return;
	}

	UTIL_FOREACH(this->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->UsedSpell(spell_id);
	}
}